

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O1

int Assimp::ASSIMP_strincmp(char *s1,char *s2,uint n)

{
  int iVar1;
  
  if (s1 == (char *)0x0) {
    __assert_fail("__null != s1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                  ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
  }
  if (s2 != (char *)0x0) {
    if (n != 0) {
      iVar1 = strncasecmp(s1,s2,(ulong)n);
      return iVar1;
    }
    return 0;
  }
  __assert_fail("__null != s2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                ,0xc0,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
}

Assistant:

AI_FORCE_INLINE
int ASSIMP_strincmp(const char *s1, const char *s2, unsigned int n) {
    ai_assert( NULL != s1 );
    ai_assert( NULL != s2 );
    if ( !n ) {
        return 0;
    }

#if (defined _MSC_VER)

    return ::_strnicmp(s1,s2,n);

#elif defined( __GNUC__ )

    return ::strncasecmp(s1,s2, n);

#else
    char c1, c2;
    unsigned int p = 0;
    do
    {
        if (p++ >= n)return 0;
        c1 = tolower(*s1++);
        c2 = tolower(*s2++);
    }
    while ( c1 && (c1 == c2) );

    return c1 - c2;
#endif
}